

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.cpp
# Opt level: O1

double __thiscall r_exec::Group::update_res(Group *this,View *v)

{
  uint16_t uVar1;
  int iVar2;
  _Mem *this_00;
  View *view;
  Group *destination;
  Code *marker;
  Mem *m;
  uint16_t i;
  bool bVar3;
  float fVar4;
  float fVar5;
  double dVar6;
  
  iVar2 = (*((v->super_View).object.object)->_vptr__Object[0xe])();
  dVar6 = 0.0;
  if ((char)iVar2 == '\0') {
    dVar6 = r_exec::View::update_res(v);
    fVar4 = (float)dVar6;
    iVar2 = (*(v->super_View).super__Object._vptr__Object[2])(v);
    if ((0.0 < fVar4) && ((char)iVar2 == '\0')) {
      (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
        super_Code.super__Object._vptr__Object[4])(this,0x1e);
      fVar5 = (float)r_code::Atom::asFloat();
      if (fVar4 < fVar5) {
        uVar1 = get_ntf_grp_count(this);
        if (uVar1 != 0) {
          i = 1;
          do {
            this_00 = (_Mem *)r_code::Mem::Get();
            view = (View *)operator_new(0x100);
            destination = get_ntf_grp(this,i);
            marker = (Code *)operator_new(0x150);
            m = (Mem *)r_code::Mem::Get();
            MkLowRes::MkLowRes((MkLowRes *)marker,m,(Code *)(v->super_View).object.object);
            NotificationView::NotificationView
                      ((NotificationView *)view,(Code *)this,(Code *)destination,marker);
            _Mem::inject_notification(this_00,view,false);
            bVar3 = i != uVar1;
            i = i + 1;
          } while (bVar3);
        }
      }
    }
    dVar6 = (double)fVar4;
  }
  return dVar6;
}

Assistant:

double Group::update_res(View *v)
{
    if (v->object->is_invalidated()) {
        return 0;
    }

    float res = v->update_res();

    if (!v->isNotification() && res > 0 && res < get_low_res_thr()) {
        uint16_t ntf_grp_count = get_ntf_grp_count();

        for (uint16_t i = 1; i <= ntf_grp_count; ++i) {
            _Mem::Get()->inject_notification(new NotificationView(this, get_ntf_grp(i), new MkLowRes(_Mem::Get(), v->object)), false);
        }
    }

    return res;
}